

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall
CTcSymLocalBase::convert_to_ctx_var(CTcSymLocalBase *this,int val_used,int val_assigned)

{
  do {
    if ((*(ushort *)&this->field_0x64 & 0x10) == 0) {
      *(ushort *)&this->field_0x64 = *(ushort *)&this->field_0x64 | 0x10;
      this->ctx_var_num_ = 0;
      this->ctx_arr_idx_ = 0;
    }
    (*(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      _vptr_CVmHashEntry[0xf])(this);
    if (val_used != 0) {
      set_val_used(this,1);
    }
    if (val_assigned != 0) {
      set_val_assigned(this,1);
    }
    this = &this->ctx_orig_->super_CTcSymLocalBase;
  } while (this != (CTcSymLocalBase *)0x0);
  return;
}

Assistant:

void CTcSymLocalBase::convert_to_ctx_var(int val_used, int val_assigned)
{
    /* if I'm not already a context local, mark me as a context local */
    if (!is_ctx_local_)
    {
        /* mark myself as a context local */
        is_ctx_local_ = TRUE;

        /* 
         *   we haven't yet assigned our local context variable, since
         *   we're still processing the inner scope at this point; just
         *   store placeholders for now so we know to come back and fix
         *   this up 
         */
        ctx_var_num_ = 0;
        ctx_arr_idx_ = 0;
    }

    /* note that I've been referenced */
    mark_referenced();

    /* propagate the value-used and value-assigned flags */
    if (val_used)
        set_val_used(TRUE);
    if (val_assigned)
        set_val_assigned(TRUE);
        
    /* propagate the conversion to the original symbol */
    if (ctx_orig_ != 0)
        ctx_orig_->convert_to_ctx_var(val_used, val_assigned);
}